

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O1

Alignment * __thiscall
spoa::SisdAlignmentEngine::Convex
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  AlignmentType AVar5;
  uint uVar6;
  uint uVar7;
  pointer ppNVar8;
  Implementation *pIVar9;
  pointer ppEVar10;
  Node *pNVar11;
  pointer ppEVar12;
  Node *pNVar13;
  int32_t *piVar14;
  pointer ppVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  pointer ppEVar19;
  pointer ppVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  pointer ppVar29;
  uint uVar30;
  ulong uVar31;
  int32_t *piVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  int iVar40;
  pointer ppEVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  ulong local_138;
  ulong local_130;
  uint local_fc;
  ulong local_f8;
  int local_ec;
  Node *local_e8;
  uint local_dc;
  AlignmentType local_d8;
  uint local_d4;
  ulong local_d0;
  Node *local_c8;
  int32_t *local_c0;
  uint local_b4;
  Graph *local_b0;
  long local_a8;
  int32_t *local_a0;
  int32_t *local_98;
  int32_t *local_90;
  pointer local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  long local_68;
  int32_t *local_60;
  int32_t *local_58;
  int32_t *local_50;
  pointer local_48;
  pointer local_40;
  int32_t *local_38;
  ulong uVar39;
  
  uVar37 = sequence_len + 1;
  uVar39 = (ulong)uVar37;
  AVar5 = (this->super_AlignmentEngine).type_;
  uVar26 = 0x80000400;
  if (AVar5 == kSW) {
    uVar26 = 0;
  }
  ppNVar8 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_48 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppNVar8 == local_48) {
    uVar28 = 0;
    uVar25 = 0;
  }
  else {
    pIVar9 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    local_68 = *(long *)&(pIVar9->node_id_to_rank).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    iVar35 = (int)(this->super_AlignmentEngine).g_;
    iVar23 = (int)(this->super_AlignmentEngine).e_;
    iVar24 = (int)(this->super_AlignmentEngine).q_;
    local_ec = (int)(this->super_AlignmentEngine).c_;
    local_a8 = uVar39 * 4;
    local_80 = uVar39 * 4 - 4;
    local_90 = pIVar9->H + 1;
    local_70 = *(long *)&(pIVar9->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl + 4;
    local_a0 = pIVar9->O + 1;
    local_98 = pIVar9->F + 1;
    local_c0 = (int32_t *)(uVar39 - 1);
    local_58 = pIVar9->Q + 1;
    local_50 = pIVar9->E + 1;
    local_38 = (int32_t *)(uVar39 - 2);
    uVar28 = 0;
    local_e8 = (Node *)CONCAT44(local_e8._4_4_,iVar35);
    uVar25 = 0;
    do {
      local_b4 = uVar26;
      local_d0 = uVar25;
      local_40 = ppNVar8;
      local_c8 = *local_40;
      local_88 = (local_c8->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar10 = (local_c8->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_88 == ppEVar10) {
        uVar25 = 0;
      }
      else {
        uVar25 = (ulong)(*(int *)(local_68 + (ulong)(*local_88)->tail->id * 4) + 1);
      }
      uVar26 = local_c8->code;
      local_dc = *(int *)(local_68 + (ulong)local_c8->id * 4) + 1;
      local_78 = (ulong)local_dc;
      if (1 < uVar37) {
        lVar22 = local_a8 * local_78;
        lVar18 = uVar25 * local_a8;
        uVar25 = 0;
        do {
          iVar38 = *(int *)((long)local_90 + uVar25 + lVar18) + iVar35;
          iVar40 = *(int *)((long)local_98 + uVar25 + lVar18) + iVar23;
          if (iVar40 < iVar38) {
            iVar40 = iVar38;
          }
          *(int *)((long)local_98 + uVar25 + lVar22) = iVar40;
          iVar38 = *(int *)((long)local_90 + uVar25 + lVar18) + iVar24;
          iVar40 = *(int *)((long)local_a0 + uVar25 + lVar18) + local_ec;
          if (iVar40 < iVar38) {
            iVar40 = iVar38;
          }
          *(int *)((long)local_a0 + uVar25 + lVar22) = iVar40;
          *(int *)((long)local_90 + uVar25 + lVar22) =
               *(int *)(local_a8 * (ulong)uVar26 + local_70 + uVar25) +
               *(int *)((long)local_90 + uVar25 + lVar18 + -4);
          uVar25 = uVar25 + 4;
        } while (local_80 != uVar25);
      }
      uVar25 = (long)ppEVar10 - (long)local_88 >> 3;
      if (1 < uVar25) {
        cVar1 = (this->super_AlignmentEngine).g_;
        cVar2 = (this->super_AlignmentEngine).e_;
        cVar3 = (this->super_AlignmentEngine).q_;
        cVar4 = (this->super_AlignmentEngine).c_;
        lVar18 = local_a8 * local_78;
        uVar27 = 1;
        do {
          if (1 < uVar37) {
            lVar22 = (ulong)(*(int *)(local_68 + (ulong)local_88[uVar27]->tail->id * 4) + 1) *
                     local_a8;
            uVar36 = 0;
            do {
              iVar38 = *(int *)((long)local_90 + uVar36 + lVar22) + (int)cVar1;
              iVar40 = *(int *)((long)local_98 + uVar36 + lVar22) + (int)cVar2;
              if (iVar40 < iVar38) {
                iVar40 = iVar38;
              }
              iVar38 = *(int *)((long)local_98 + uVar36 + lVar18);
              if (iVar40 < iVar38) {
                iVar40 = iVar38;
              }
              *(int *)((long)local_98 + uVar36 + lVar18) = iVar40;
              iVar38 = *(int *)((long)local_90 + uVar36 + lVar22) + (int)cVar3;
              iVar40 = *(int *)((long)local_a0 + uVar36 + lVar22) + (int)cVar4;
              if (iVar40 < iVar38) {
                iVar40 = iVar38;
              }
              iVar38 = *(int *)((long)local_a0 + uVar36 + lVar18);
              if (iVar40 < iVar38) {
                iVar40 = iVar38;
              }
              *(int *)((long)local_a0 + uVar36 + lVar18) = iVar40;
              iVar38 = *(int *)((ulong)uVar26 * local_a8 + local_70 + uVar36) +
                       *(int *)((long)local_90 + uVar36 + lVar22 + -4);
              iVar40 = *(int *)((long)local_90 + uVar36 + lVar18);
              if (iVar38 < iVar40) {
                iVar38 = iVar40;
              }
              *(int *)((long)local_90 + uVar36 + lVar18) = iVar38;
              uVar36 = uVar36 + 4;
            } while (local_80 != uVar36);
          }
          uVar27 = (ulong)((int)uVar27 + 1);
        } while (uVar27 < uVar25);
      }
      uVar25 = local_d0;
      uVar26 = local_b4;
      if (1 < uVar37) {
        lVar18 = local_78 * local_a8;
        piVar32 = (int32_t *)0x0;
        uVar33 = local_b4;
        uVar30 = local_b4;
        do {
          iVar38 = *(int *)((long)local_90 + (long)piVar32 * 4 + lVar18 + -4) + iVar35;
          iVar40 = *(int *)((long)local_50 + (long)piVar32 * 4 + lVar18 + -4) + iVar23;
          if (iVar40 < iVar38) {
            iVar40 = iVar38;
          }
          *(int *)((long)local_50 + (long)piVar32 * 4 + lVar18) = iVar40;
          uVar26 = *(int *)((long)local_90 + (long)piVar32 * 4 + lVar18 + -4) + iVar24;
          uVar21 = *(int *)((long)local_58 + (long)piVar32 * 4 + lVar18 + -4) + local_ec;
          if ((int)uVar21 < (int)uVar26) {
            uVar21 = uVar26;
          }
          *(uint *)((long)local_58 + (long)piVar32 * 4 + lVar18) = uVar21;
          uVar26 = *(uint *)((long)local_98 + (long)piVar32 * 4 + lVar18);
          uVar6 = *(uint *)((long)local_50 + (long)piVar32 * 4 + lVar18);
          uVar7 = *(uint *)((long)local_a0 + (long)piVar32 * 4 + lVar18);
          if ((int)uVar6 < (int)uVar26) {
            uVar6 = uVar26;
          }
          if ((int)uVar21 <= (int)uVar7) {
            uVar21 = uVar7;
          }
          uVar26 = *(uint *)((long)local_90 + (long)piVar32 * 4 + lVar18);
          if ((int)uVar21 < (int)uVar6) {
            uVar21 = uVar6;
          }
          if ((int)uVar21 < (int)uVar26) {
            uVar21 = uVar26;
          }
          *(uint *)((long)local_90 + (long)piVar32 * 4 + lVar18) = uVar21;
          uVar26 = uVar33;
          if (AVar5 == kOV) {
            if ((local_c8->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                (local_c8->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_001225e3:
              uVar21 = *(uint *)((long)local_90 + (long)piVar32 * 4 + lVar18);
              if ((int)uVar33 <= (int)uVar21) {
                uVar30 = uVar21;
              }
              uVar26 = uVar30;
              if ((int)uVar33 < (int)uVar21) {
                uVar28 = (ulong)local_dc;
                uVar25 = (ulong)((int)piVar32 + 1);
              }
            }
          }
          else if (AVar5 == kNW) {
            if ((local_38 == piVar32) &&
               ((local_c8->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                (local_c8->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish)) goto LAB_001225e3;
          }
          else if (AVar5 == kSW) {
            uVar21 = ~((int)uVar21 >> 0x1f) & uVar21;
            *(uint *)((long)local_90 + (long)piVar32 * 4 + lVar18) = uVar21;
            uVar26 = uVar30;
            if ((int)uVar33 <= (int)uVar21) {
              uVar26 = uVar21;
            }
            uVar30 = uVar26;
            if ((int)uVar33 < (int)uVar21) {
              uVar28 = (ulong)local_dc;
              uVar25 = (ulong)((int)piVar32 + 1);
            }
          }
          piVar32 = (int32_t *)((long)piVar32 + 1);
          uVar33 = uVar26;
        } while (local_c0 != piVar32);
      }
      ppNVar8 = local_40 + 1;
      local_d8 = AVar5;
    } while (local_40 + 1 != local_48);
  }
  if ((int)uVar28 == 0 && (int)uVar25 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar26;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = 0;
  local_130 = 0;
  local_b0 = graph;
  local_60 = score;
  do {
    AVar5 = (this->super_AlignmentEngine).type_;
    iVar23 = (int)uVar28;
    uVar26 = (uint)uVar25;
    if (AVar5 == kOV) {
      uVar37 = uVar26;
      if (iVar23 == 0) goto LAB_00122e16;
joined_r0x00122707:
      if (uVar37 == 0) goto LAB_00122e16;
    }
    else {
      if (AVar5 != kNW) {
        if (AVar5 == kSW) {
          uVar37 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar28 * uVar39 + uVar25];
          goto joined_r0x00122707;
        }
LAB_00122e16:
        ppVar29 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar15 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        ppVar20 = ppVar15 + -1;
        if (ppVar20 <= ppVar29 || ppVar29 == ppVar15) {
          return __return_storage_ptr__;
        }
        do {
          iVar23 = ppVar29->first;
          ppVar29->first = ppVar20->first;
          ppVar20->first = iVar23;
          iVar23 = ppVar29->second;
          ppVar29->second = ppVar20->second;
          ppVar20->second = iVar23;
          ppVar29 = ppVar29 + 1;
          ppVar20 = ppVar20 + -1;
        } while (ppVar29 < ppVar20);
        return __return_storage_ptr__;
      }
      if (iVar23 == 0 && uVar26 == 0) goto LAB_00122e16;
    }
    pIVar9 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    piVar32 = pIVar9->H;
    lVar18 = uVar28 * uVar39;
    iVar24 = piVar32[lVar18 + uVar25];
    bVar44 = false;
    uVar27 = local_138;
    uVar36 = local_130;
    if ((uVar26 != 0) && (iVar23 != 0)) {
      pNVar11 = (local_b0->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar23 - 1];
      ppEVar10 = (pNVar11->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar12 = *(pointer *)
                  ((long)&(pNVar11->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar10 == ppEVar12) {
        uVar37 = 0;
      }
      else {
        uVar37 = *(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         + (ulong)(*ppEVar10)->tail->id * 4) + 1;
      }
      iVar35 = *(int *)(pNVar11->code * uVar39 * 4 +
                        *(long *)&(pIVar9->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar25 * 4
                       );
      uVar27 = (ulong)(uVar26 - 1);
      bVar44 = true;
      if (iVar24 == piVar32[uVar37 * uVar39 + uVar27] + iVar35) {
        uVar36 = (ulong)uVar37;
      }
      else {
        uVar34 = (long)ppEVar12 - (long)ppEVar10 >> 3;
        if (uVar34 < 2) {
          bVar44 = false;
          uVar27 = local_138;
        }
        else {
          uVar36 = 1;
          uVar37 = 2;
          do {
            uVar36 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar10[uVar36]->tail->id * 4) + 1);
            local_d0 = uVar25;
            if (iVar24 == piVar32[uVar27 + uVar36 * uVar39] + iVar35) goto LAB_00122854;
            uVar36 = (ulong)uVar37;
            uVar37 = uVar37 + 1;
          } while (uVar36 < uVar34);
          bVar44 = false;
          uVar27 = local_138;
          uVar36 = local_130;
        }
      }
    }
LAB_00122854:
    local_130 = uVar36;
    local_138 = uVar27;
    bVar43 = false;
    uVar27 = local_138;
    uVar36 = local_130;
    bVar17 = bVar44;
    if ((!bVar44) && (iVar23 != 0)) {
      pNVar11 = (local_b0->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar23 - 1];
      pNVar13 = *(Node **)&(pNVar11->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl.super__Vector_impl_data;
      pNVar11 = *(Node **)((long)&(pNVar11->inedges).
                                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                  ._M_impl + 8);
      if (pNVar13 == pNVar11) {
        uVar37 = 0;
      }
      else {
        uVar37 = *(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         + (ulong)*(uint *)**(undefined8 **)pNVar13 * 4) + 1;
      }
      lVar22 = uVar37 * uVar39;
      iVar35 = (int)(this->super_AlignmentEngine).e_;
      bVar43 = iVar24 == pIVar9->F[lVar22 + uVar25] + iVar35;
      uVar27 = uVar25;
      if (bVar43) {
        uVar36 = (ulong)uVar37;
        bVar17 = true;
      }
      else {
        uVar33 = (uint)(this->super_AlignmentEngine).g_;
        local_80 = (ulong)uVar33;
        local_e8 = pNVar13;
        if (iVar24 != uVar33 + piVar32[lVar22 + uVar25]) {
          piVar14 = pIVar9->O;
          local_ec = (int)(this->super_AlignmentEngine).c_;
          bVar43 = iVar24 == piVar14[lVar22 + uVar25] + local_ec;
          if ((!bVar43) &&
             (local_d8 = (AlignmentType)(this->super_AlignmentEngine).q_, local_c0 = piVar14,
             iVar24 != piVar32[lVar22 + uVar25] + local_d8)) {
            uVar34 = (long)pNVar11 - (long)pNVar13 >> 3;
            uVar27 = local_138;
            if (1 < uVar34) {
              local_c8 = (Node *)(piVar32 + uVar25);
              local_88 = (pointer)(piVar14 + uVar25);
              local_c0 = *(int32_t **)
                          &(pIVar9->node_id_to_rank).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
              uVar31 = 1;
              uVar42 = 2;
              do {
                uVar36 = (ulong)(local_c0[*(uint *)**(undefined8 **)(&pNVar13->id + uVar31 * 2)] + 1
                                );
                lVar22 = uVar36 * uVar39;
                bVar43 = (bool)(iVar24 == pIVar9->F[uVar25 + lVar22] + iVar35 | bVar43);
                uVar27 = uVar25;
                bVar17 = true;
                if (bVar43) break;
                if (((iVar24 == uVar33 + (&local_c8->id)[lVar22]) ||
                    (bVar43 = iVar24 == *(int *)((long)local_88 + lVar22 * 4) + local_ec, bVar43))
                   || (iVar24 == (&local_c8->id)[lVar22] + local_d8)) {
                  bVar17 = true;
                  break;
                }
                bVar16 = uVar42 < uVar34;
                uVar31 = uVar42;
                uVar42 = (ulong)((int)uVar42 + 1);
                uVar27 = local_138;
                uVar36 = local_130;
                bVar17 = bVar44;
              } while (bVar16);
            }
            goto LAB_0012299f;
          }
        }
        local_130 = (ulong)uVar37;
        uVar36 = local_130;
        bVar17 = true;
      }
    }
LAB_0012299f:
    local_130 = uVar36;
    local_138 = uVar27;
    bVar44 = false;
    if ((!bVar17) && (bVar44 = false, uVar26 != 0)) {
      bVar44 = iVar24 == (int)(this->super_AlignmentEngine).e_ + pIVar9->E[lVar18 + (uVar25 - 1)];
      if (!bVar44) {
        if (iVar24 == (int)(this->super_AlignmentEngine).g_ + piVar32[lVar18 + (uVar25 - 1)]) {
          bVar44 = false;
        }
        else {
          bVar44 = iVar24 == (int)(this->super_AlignmentEngine).c_ +
                             pIVar9->Q[lVar18 + (uVar25 - 1)];
          if ((!bVar44) &&
             (bVar44 = false,
             iVar24 != piVar32[lVar18 + (uVar25 - 1)] + (int)(this->super_AlignmentEngine).q_))
          goto LAB_00122a14;
        }
      }
      local_138 = (ulong)(uVar26 - 1);
      local_130 = uVar28;
    }
LAB_00122a14:
    local_fc = 0xffffffff;
    if (iVar23 != (int)local_130) {
      local_fc = (local_b0->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar23 - 1]->id;
    }
    local_d4 = uVar26 - 1;
    if (uVar26 == (uint)local_138) {
      local_d4 = 0xffffffff;
    }
    local_f8 = uVar28;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_fc,&local_d4);
    uVar28 = local_130;
    if (bVar44) {
      lVar18 = local_130 * uVar39;
      uVar26 = (uint)local_138;
      do {
        do {
          uVar26 = uVar26 - 1;
          uVar25 = (ulong)uVar26;
          local_fc = 0xffffffff;
          local_d4 = uVar26;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int,unsigned_int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,(int *)&local_fc,&local_d4);
          pIVar9 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl;
          piVar32 = pIVar9->E;
        } while ((int)(this->super_AlignmentEngine).e_ + piVar32[lVar18 + uVar25] ==
                 piVar32[lVar18 + uVar25 + 1]);
        piVar32 = pIVar9->Q;
      } while ((int)(this->super_AlignmentEngine).c_ + piVar32[lVar18 + uVar25] ==
               piVar32[lVar18 + uVar25 + 1]);
    }
    else {
      uVar25 = local_138;
      if (bVar43) {
        do {
          local_e8 = (local_b0->rank_to_node_).
                     super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)local_130 - 1];
          ppEVar10 = (local_e8->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar12 = *(pointer *)
                      ((long)&(local_e8->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar10 == ppEVar12) {
            bVar44 = true;
            uVar28 = 0;
          }
          else {
            pIVar9 = (this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                     _M_head_impl;
            uVar28 = 0;
            bVar44 = true;
            ppEVar19 = ppEVar10;
            do {
              ppEVar41 = ppEVar19 + 1;
              uVar27 = (ulong)(*(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar19)->tail->id * 4) + 1);
              if (pIVar9->F[local_138 + local_130 * uVar39] ==
                  pIVar9->F[local_138 + uVar27 * uVar39] + (int)(this->super_AlignmentEngine).e_) {
                bVar44 = false;
                bVar43 = true;
                uVar28 = uVar27;
              }
              else {
                bVar43 = pIVar9->O[local_130 * uVar39 + local_138] ==
                         pIVar9->O[uVar27 * uVar39 + local_138] +
                         (int)(this->super_AlignmentEngine).c_;
                if (bVar43) {
                  bVar44 = false;
                  uVar28 = uVar27;
                }
              }
            } while ((!bVar43) && (ppEVar19 = ppEVar41, ppEVar41 != ppEVar12));
          }
          if (bVar44 == true && ppEVar10 != ppEVar12) {
            pIVar9 = (this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                     _M_head_impl;
            do {
              ppEVar19 = ppEVar10 + 1;
              uVar26 = *(int *)(*(long *)&(pIVar9->node_id_to_rank).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               + (ulong)(*ppEVar10)->tail->id * 4) + 1;
              uVar27 = (ulong)uVar26;
              bVar43 = true;
              if ((pIVar9->F[local_130 * uVar39 + local_138] !=
                   pIVar9->H[local_138 + uVar27 * uVar39] + (int)(this->super_AlignmentEngine).g_)
                 && (bVar43 = pIVar9->O[local_130 * uVar39 + local_138] ==
                              pIVar9->H[local_138 + uVar27 * uVar39] +
                              (int)(this->super_AlignmentEngine).q_, uVar27 = uVar28, bVar43)) {
                uVar27 = (ulong)uVar26;
              }
              uVar28 = uVar27;
            } while ((!bVar43) && (ppEVar10 = ppEVar19, ppEVar19 != ppEVar12));
          }
          local_130 = uVar28;
          local_fc = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,&local_e8->id,(int *)&local_fc);
          uVar28 = local_130;
        } while (!bVar44 && (int)local_130 != 0);
      }
    }
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Convex(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    std::int32_t* O_row = &(pimpl_->O[i * matrix_width]);
    std::int32_t* O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

    // update F, O and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(H_pred_row[j] + g_, F_pred_row[j] + e_);
      O_row[j] = std::max(H_pred_row[j] + q_, O_pred_row[j] + c_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);
      O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        O_row[j] = std::max(
            O_row[j],
            std::max(
                H_pred_row[j] + q_,
                O_pred_row[j] + c_));
        H_row[j] = std::max(H_row[j], H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E, Q and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    std::int32_t* Q_row = &(pimpl_->Q[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      Q_row[j] = std::max(H_row[j - 1] + q_, Q_row[j - 1] + c_);
      H_row[j] = std::max(
        H_row[j],
        std::max(
            std::max(F_row[j], E_row[j]),
            std::max(O_row[j], Q_row[j])));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
        pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||
          (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||  // NOLINT
              (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left |= H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + g_  ||
          (extend_left |= H_ij == pimpl_->Q[i * matrix_width + j - 1] + c_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + q_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ != pimpl_->E[i * matrix_width + j + 1] &&  // NOLINT
            pimpl_->Q[i * matrix_width + j] + c_ != pimpl_->Q[i * matrix_width + j + 1]) {  // NOLINT
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = true;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if (pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_ ||  // NOLINT
              pimpl_->O[i * matrix_width + j] == pimpl_->O[pred_i * matrix_width + j] + c_) {  // NOLINT
            prev_i = pred_i;
            stop = false;
            break;
          }
        }
        if (stop == true) {
          for (const auto& it : rank_to_node[i - 1]->inedges) {
            std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

            if (pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_ ||  // NOLINT
                pimpl_->O[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + q_) {  // NOLINT
              prev_i = pred_i;
              break;
            }
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;

        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}